

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O2

string * __thiscall
adios2::Remote::GetKeyFromConnectionManager
          (string *__return_storage_ptr__,Remote *this,string *keyID)

{
  int iVar1;
  char *pcVar2;
  char *__s1;
  allocator local_95c;
  allocator local_95b;
  allocator local_95a;
  allocator local_959;
  NetworkSocket socket;
  char *value;
  char *rest;
  string request;
  string local_918;
  string local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  string local_898;
  string local_878;
  string local_858;
  char response [2048];
  
  helper::NetworkSocket::NetworkSocket(&socket);
  std::__cxx11::string::string((string *)&local_8f8,"localhost",(allocator *)response);
  std::__cxx11::string::string((string *)&local_918,"tcp",(allocator *)&request);
  helper::NetworkSocket::Connect(&socket,&local_8f8,30000,&local_918);
  std::__cxx11::string::~string((string *)&local_918);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::operator+(&request,"/get_key?id=",keyID);
  helper::NetworkSocket::RequestResponse(&socket,&request,response,0x800);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  rest = response;
  while( true ) {
    do {
      pcVar2 = strtok_r(rest,",",&rest);
      if (pcVar2 == (char *)0x0) {
        helper::NetworkSocket::Close(&socket);
        std::__cxx11::string::~string((string *)&request);
        helper::NetworkSocket::~NetworkSocket(&socket);
        return __return_storage_ptr__;
      }
      value = pcVar2;
      __s1 = strtok_r(pcVar2,":",&value);
      iVar1 = strncmp(__s1,"port",4);
      pcVar2 = value;
    } while (iVar1 == 0);
    if (*__s1 != 'm') break;
    if ((__s1[1] != 's') || (__s1[2] != 'g')) goto LAB_005f58aa;
    iVar1 = strcmp(value,"no_error");
    if ((iVar1 != 0) && (iVar1 = strcmp(pcVar2,"cannot_find_key_id"), iVar1 != 0)) {
      std::__cxx11::string::string((string *)&local_858,"Toolkit",&local_959);
      std::__cxx11::string::string((string *)&local_878,"Remote",&local_95a);
      std::__cxx11::string::string((string *)&local_898,"GetKey",&local_95b);
      std::__cxx11::string::string((string *)&local_8d8,value,&local_95c);
      std::operator+(&local_8b8,"Error response from connection manager: ",&local_8d8);
      helper::Throw<std::invalid_argument>(&local_858,&local_878,&local_898,&local_8b8,-1);
LAB_005f591d:
      std::__cxx11::string::~string((string *)&local_8b8);
      std::__cxx11::string::~string((string *)&local_8d8);
      std::__cxx11::string::~string((string *)&local_898);
      std::__cxx11::string::~string((string *)&local_878);
LAB_005f593d:
      std::__cxx11::string::~string((string *)&local_858);
    }
  }
  if (((*__s1 != 'k') || (__s1[1] != 'e')) || (__s1[2] != 'y')) {
LAB_005f58aa:
    std::__cxx11::string::string((string *)&local_858,"Toolkit",&local_959);
    std::__cxx11::string::string((string *)&local_878,"Remote",&local_95a);
    std::__cxx11::string::string((string *)&local_898,"EstablishConnection",&local_95b);
    std::__cxx11::string::string((string *)&local_8d8,__s1,&local_95c);
    std::operator+(&local_8b8,"Invalid response from connection manager. Do not understand key ",
                   &local_8d8);
    helper::Throw<std::invalid_argument>(&local_858,&local_878,&local_898,&local_8b8,-1);
    goto LAB_005f591d;
  }
  std::__cxx11::string::string((string *)&local_858,value,(allocator *)&local_878);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_858);
  goto LAB_005f593d;
}

Assistant:

std::string Remote::GetKeyFromConnectionManager(const std::string keyID)
{
    helper::NetworkSocket socket;
    socket.Connect("localhost", 30000);
    std::string request = "/get_key?id=" + keyID;

    char response[2048];
    socket.RequestResponse(request, response, 2048);

    // responses:
    //   "port:-1,msg:incomplete_service_definition
    //   "key:0,msg:missing_key_id_in_request"
    //   "key:0,msg:cannot_find_key_id"
    //   "key:5980a49cb5e0c4a6042f73f7ce0277d3a577e1af9cfc530e4f5683a615815d6a,msg:no_error"

    char *token;
    char *rest = response;

    std::string keyhex;

    // std::cout << "Response from Connection manager = \"" << response << "\"" << std::endl;
    while ((token = strtok_r(rest, ",", &rest)))
    {
        char *key;
        char *value = token;
        key = strtok_r(value, ":", &value);
        if (!strncmp(key, "port", 4))
        {
            ; // we don't care about port, msg will throw the error message
        }
        else if (!strncmp(key, "key", 3))
        {
            keyhex = std::string(value);
        }
        else if (!strncmp(key, "msg", 3))
        {
            if (strcmp(value, "no_error") && strcmp(value, "cannot_find_key_id"))
            {
                helper::Throw<std::invalid_argument>("Toolkit", "Remote", "GetKey",
                                                     "Error response from connection manager: " +
                                                         std::string(value));
            }
        }
        else
        {
            helper::Throw<std::invalid_argument>(
                "Toolkit", "Remote", "EstablishConnection",
                "Invalid response from connection manager. Do not understand key " +
                    std::string(key));
        }
    }

    socket.Close();
    return keyhex;
}